

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatMem.c
# Opt level: O3

Msat_MmStep_t * Msat_MmStepStart(int nSteps)

{
  undefined1 auVar1 [16];
  int iVar2;
  Msat_MmStep_t *pMVar3;
  Msat_MmFixed_t **ppMVar4;
  Msat_MmFixed_t **ppMVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  Msat_MmFixed_t *pMVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  pMVar3 = (Msat_MmStep_t *)malloc(0x20);
  pMVar3->nMems = nSteps;
  pMVar10 = (Msat_MmFixed_t *)(long)nSteps;
  ppMVar4 = (Msat_MmFixed_t **)malloc((long)pMVar10 * 8);
  pMVar3->pMems = ppMVar4;
  if (0 < nSteps) {
    uVar11 = 0;
    do {
      pMVar10 = Msat_MmFixedStart(8 << ((byte)uVar11 & 0x1f));
      ppMVar4[uVar11] = pMVar10;
      uVar11 = uVar11 + 1;
    } while ((uint)nSteps != uVar11);
    pMVar10 = *ppMVar4;
  }
  iVar2 = 4 << ((byte)nSteps & 0x1f);
  pMVar3->nMapSize = iVar2;
  ppMVar5 = (Msat_MmFixed_t **)malloc((long)(iVar2 + 1) << 3);
  pMVar3->pMap = ppMVar5;
  *ppMVar5 = (Msat_MmFixed_t *)0x0;
  auVar12._8_4_ = (int)pMVar10;
  auVar12._0_8_ = pMVar10;
  auVar12._12_4_ = (int)((ulong)pMVar10 >> 0x20);
  *(undefined1 (*) [16])(ppMVar5 + 1) = auVar12;
  *(undefined1 (*) [16])(ppMVar5 + 3) = auVar12;
  auVar1 = _DAT_0093d220;
  auVar12 = _DAT_0093d210;
  if (0 < nSteps) {
    uVar11 = 0;
    do {
      iVar7 = 4 << ((byte)uVar11 & 0x1f);
      iVar2 = 8 << ((byte)uVar11 & 0x1f);
      if (iVar7 < iVar2) {
        pMVar10 = ppMVar4[uVar11];
        uVar6 = (iVar2 - iVar7) - 4;
        uVar8 = uVar6 | 3;
        auVar13._4_4_ = 0;
        auVar13._0_4_ = uVar8;
        auVar13._8_4_ = uVar8;
        auVar13._12_4_ = 0;
        auVar13 = auVar13 ^ auVar1;
        lVar9 = 0;
        do {
          auVar14._8_4_ = (int)lVar9;
          auVar14._0_8_ = lVar9;
          auVar14._12_4_ = (int)((ulong)lVar9 >> 0x20);
          auVar14 = (auVar14 | auVar12) ^ auVar1;
          if ((bool)(~(auVar13._4_4_ < auVar14._4_4_ ||
                      auVar13._0_4_ < auVar14._0_4_ && auVar14._4_4_ == auVar13._4_4_) & 1)) {
            ppMVar5[(long)iVar7 + lVar9 + 1] = pMVar10;
          }
          if (auVar14._12_4_ <= auVar13._12_4_ &&
              (auVar14._8_4_ <= auVar13._8_4_ || auVar14._12_4_ != auVar13._12_4_)) {
            ppMVar5[(long)iVar7 + lVar9 + 2] = pMVar10;
          }
          lVar9 = lVar9 + 2;
        } while ((ulong)uVar6 + 4 != lVar9);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != (uint)nSteps);
  }
  return pMVar3;
}

Assistant:

Msat_MmStep_t * Msat_MmStepStart( int nSteps )
{
    Msat_MmStep_t * p;
    int i, k;
    p = ABC_ALLOC( Msat_MmStep_t, 1 );
    p->nMems = nSteps;
    // start the fixed memory managers
    p->pMems = ABC_ALLOC( Msat_MmFixed_t *, p->nMems );
    for ( i = 0; i < p->nMems; i++ )
        p->pMems[i] = Msat_MmFixedStart( (8<<i) );
    // set up the mapping of the required memory size into the corresponding manager
    p->nMapSize = (4<<p->nMems);
    p->pMap = ABC_ALLOC( Msat_MmFixed_t *, p->nMapSize+1 );
    p->pMap[0] = NULL;
    for ( k = 1; k <= 4; k++ )
        p->pMap[k] = p->pMems[0];
    for ( i = 0; i < p->nMems; i++ )
        for ( k = (4<<i)+1; k <= (8<<i); k++ )
            p->pMap[k] = p->pMems[i];
//for ( i = 1; i < 100; i ++ )
//printf( "%10d: size = %10d\n", i, p->pMap[i]->nEntrySize );
    return p;
}